

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

double units::readNumericalWords(string *ustring,size_t *index)

{
  pointer pcVar1;
  double dVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  char *pcVar9;
  bool bVar10;
  ulong uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar14;
  undefined1 auVar15 [16];
  size_t index_sub;
  string lcstring;
  undefined1 local_a8 [16];
  size_t local_90;
  string local_88;
  string local_68;
  undefined1 local_48 [16];
  double local_38;
  
  *index = 0;
  local_a8 = ZEXT816(0x7ff4000000000000);
  auVar15 = local_a8;
  local_a8._0_8_ = NAN;
  if (2 < ustring->_M_string_length) {
    if ((hasValidNumericalWordStart(std::__cxx11::string_const&)::first_letters_abi_cxx11_ == '\0')
       && (iVar5 = __cxa_guard_acquire(&hasValidNumericalWordStart(std::__cxx11::string_const&)::
                                        first_letters_abi_cxx11_), iVar5 != 0)) {
      hasValidNumericalWordStart(std::__cxx11::string_const&)::first_letters_abi_cxx11_._0_8_ =
           0x1a6cb8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 hasValidNumericalWordStart(std::__cxx11::string_const&)::first_letters_abi_cxx11_,
                 "otfsenhmbtzaOTFSENHMBTZA","");
      __cxa_atexit(std::__cxx11::string::~string,
                   hasValidNumericalWordStart(std::__cxx11::string_const&)::first_letters_abi_cxx11_
                   ,&__dso_handle);
      __cxa_guard_release(&hasValidNumericalWordStart(std::__cxx11::string_const&)::
                           first_letters_abi_cxx11_);
    }
    if ((hasValidNumericalWordStart(std::__cxx11::string_const&)::second_letters_abi_cxx11_ == '\0')
       && (iVar5 = __cxa_guard_acquire(&hasValidNumericalWordStart(std::__cxx11::string_const&)::
                                        second_letters_abi_cxx11_), iVar5 != 0)) {
      hasValidNumericalWordStart(std::__cxx11::string_const&)::second_letters_abi_cxx11_._0_8_ =
           0x1a6ce0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 hasValidNumericalWordStart(std::__cxx11::string_const&)::second_letters_abi_cxx11_,
                 "nwhoielurNWHOIELUR","");
      __cxa_atexit(std::__cxx11::string::~string,
                   hasValidNumericalWordStart(std::__cxx11::string_const&)::
                   second_letters_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&hasValidNumericalWordStart(std::__cxx11::string_const&)::
                           second_letters_abi_cxx11_);
    }
    local_a8._0_8_ = NAN;
    lVar7 = std::__cxx11::string::find(-0x58,(ulong)(uint)(int)*(ustring->_M_dataplus)._M_p);
    if ((lVar7 != -1) &&
       (lVar7 = std::__cxx11::string::find(-0x30,(ulong)(uint)(int)(ustring->_M_dataplus)._M_p[1]),
       lVar7 != -1)) {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      pcVar1 = (ustring->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,pcVar1,pcVar1 + ustring->_M_string_length);
      sVar4 = local_68._M_string_length;
      _Var3._M_p = local_68._M_dataplus._M_p;
      if ((char *)local_68._M_string_length != (char *)0x0) {
        pcVar9 = (char *)0x0;
        do {
          iVar5 = tolower((int)_Var3._M_p[(long)pcVar9]);
          _Var3._M_p[(long)pcVar9] = (char)iVar5;
          pcVar9 = pcVar9 + 1;
        } while ((char *)sVar4 != pcVar9);
      }
      bVar10 = false;
      lVar7 = 0;
      local_a8 = auVar15;
      do {
        pcVar9 = *(char **)((long)&DAT_0018e920 + lVar7);
        strlen(pcVar9);
        uVar8 = std::__cxx11::string::find((char *)&local_68,(ulong)pcVar9,0);
        if (uVar8 != 0xffffffffffffffff) {
          if (uVar8 == 0) {
            local_90 = 0;
            local_a8._0_8_ = *(double *)((long)&DAT_0018e918 + lVar7);
            local_a8._8_8_ = 0;
            iVar5 = *(int *)((long)&groupNumericalWords + lVar7);
            *index = (size_t)(long)iVar5;
            if ((char *)(long)iVar5 < local_68._M_string_length) {
              std::__cxx11::string::substr((ulong)&local_88,(ulong)&local_68);
              dVar2 = readNumericalWords(&local_88,&local_90);
              uVar12 = SUB84(dVar2,0);
              uVar13 = (undefined4)((ulong)dVar2 >> 0x20);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88._M_dataplus._M_p != &local_88.field_2) {
                local_48._0_8_ = dVar2;
                operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1
                               );
                uVar12 = local_48._0_4_;
                uVar13 = local_48._4_4_;
              }
              if (!NAN((double)CONCAT44(uVar13,uVar12)) && !NAN((double)CONCAT44(uVar13,uVar12))) {
                uVar11 = -(ulong)((double)CONCAT44(uVar13,uVar12) < (double)local_a8._0_8_);
                local_a8._8_8_ = 0;
                local_a8._0_8_ =
                     ~uVar11 & (ulong)((double)local_a8._0_8_ * (double)CONCAT44(uVar13,uVar12)) |
                     (ulong)((double)local_a8._0_8_ + (double)CONCAT44(uVar13,uVar12)) & uVar11;
                *index = *index + local_90;
              }
            }
          }
          else {
            local_90 = 0;
            local_48._8_8_ = 0;
            local_48._0_8_ = *(ulong *)((long)&DAT_0018e918 + lVar7);
            pcVar9 = (char *)((long)*(int *)((long)&groupNumericalWords + lVar7) + uVar8);
            *index = (size_t)pcVar9;
            local_38 = 0.0;
            if (pcVar9 < local_68._M_string_length) {
              std::__cxx11::string::substr((ulong)&local_88,(ulong)&local_68);
              dVar2 = readNumericalWords(&local_88,&local_90);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_88._M_dataplus._M_p != &local_88.field_2) {
                operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1
                               );
              }
              if (!NAN(dVar2)) {
                dVar14 = (double)local_48._0_8_;
                if ((double)local_48._0_8_ <= dVar2) {
                  dVar14 = (double)local_48._0_8_ * dVar2;
                }
                auVar15._8_8_ = local_48._8_8_;
                auVar15._0_8_ = dVar14;
                *index = *index + local_90;
                local_38 = (double)(-(ulong)(dVar2 < (double)local_48._0_8_) & (ulong)dVar2);
                local_48 = auVar15;
              }
            }
            std::__cxx11::string::substr((ulong)&local_88,(ulong)&local_68);
            dVar2 = readNumericalWords(&local_88,&local_90);
            local_a8._8_4_ = extraout_XMM0_Dc;
            local_a8._0_8_ = dVar2;
            local_a8._12_4_ = extraout_XMM0_Dd;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p != &local_88.field_2) {
              operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
            }
            if ((NAN(dVar2)) || (local_90 < uVar8)) {
              *index = local_90;
            }
            else {
              local_a8._8_8_ = 0;
              local_a8._0_8_ = local_38 + (double)local_48._0_8_ * dVar2;
            }
          }
        }
        if (uVar8 != 0xffffffffffffffff) break;
        lVar7 = lVar7 + 0x18;
        bVar10 = lVar7 == 0x90;
      } while (!bVar10);
      if (bVar10) {
        iVar5 = std::__cxx11::string::compare((ulong)&local_68,0,(char *)0x3);
        if (iVar5 == 0) {
          *index = *index + 3;
        }
        lVar7 = 0x10;
        bVar10 = false;
        do {
          iVar5 = *(int *)(&UNK_0018e990 + lVar7);
          iVar6 = std::__cxx11::string::compare((ulong)&local_68,*index,(char *)(long)iVar5);
          if (iVar6 == 0) {
            pcVar9 = (char *)(long)iVar5 + *index;
            local_a8._0_8_ = *(undefined8 *)(&UNK_0018e998 + lVar7);
            local_a8._8_8_ = 0;
            *index = (size_t)pcVar9;
            if (pcVar9 < local_68._M_string_length) {
              if (local_68._M_dataplus._M_p[(long)pcVar9] == '-') {
                *index = (size_t)(pcVar9 + 1);
              }
              dVar2 = read1To10(&local_68,index);
              local_a8._8_8_ = 0;
              local_a8._0_8_ =
                   local_a8._0_8_ & -(ulong)NAN(dVar2) |
                   ~-(ulong)NAN(dVar2) & (ulong)((double)local_a8._0_8_ + dVar2);
            }
          }
          if (iVar6 == 0) break;
          lVar7 = lVar7 + 0x18;
          bVar10 = lVar7 == 0xd0;
        } while (!bVar10);
        if (bVar10) {
          lVar7 = 0x10;
          do {
            iVar5 = *(int *)(&UNK_0018eb28 + lVar7);
            iVar6 = std::__cxx11::string::compare((ulong)&local_68,*index,(char *)(long)iVar5);
            if (iVar6 == 0) {
              *index = (size_t)((char *)(long)iVar5 + *index);
              local_a8._0_4_ = (undefined4)*(undefined8 *)(&UNK_0018eb30 + lVar7);
              local_a8._4_4_ = (undefined4)((ulong)*(undefined8 *)(&UNK_0018eb30 + lVar7) >> 0x20);
              goto LAB_0015a421;
            }
            lVar7 = lVar7 + 0x18;
          } while (lVar7 != 0x118);
          local_a8._0_4_ = 0;
          local_a8._4_4_ = 0x7ff40000;
LAB_0015a421:
          if (NAN((double)CONCAT44(local_a8._4_4_,local_a8._0_4_)) ||
              NAN((double)CONCAT44(local_a8._4_4_,local_a8._0_4_))) {
            local_a8._0_8_ = read1To10(&local_68,index);
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return (double)local_a8._0_8_;
}

Assistant:

static double readNumericalWords(const std::string& ustring, size_t& index)
{
    double val = constants::invalid_conversion;
    index = 0;
    if (ustring.size() < 3) {
        return val;
    }
    if (!hasValidNumericalWordStart(ustring)) {
        return val;
    }
    std::string lcstring{ustring};
    // make the string lower case for consistency
    std::transform(
        lcstring.begin(), lcstring.end(), lcstring.begin(), ::tolower);
    for (const auto& wp : groupNumericalWords) {
        auto loc = lcstring.find(std::get<0>(wp));
        if (loc != std::string::npos) {
            if (loc == 0) {
                size_t index_sub{0};
                val = std::get<1>(wp);
                index = std::get<2>(wp);
                if (index < lcstring.size()) {
                    double val_p2 =
                        readNumericalWords(lcstring.substr(index), index_sub);
                    if (!std::isnan(val_p2)) {
                        if (val_p2 >= val) {
                            val = val * val_p2;
                        } else {
                            val += val_p2;
                        }

                        index += index_sub;
                    }
                }
                return val;
            }
            size_t index_sub{0};
            val = std::get<1>(wp);
            index = loc + std::get<2>(wp);
            // read the next component
            double val_add{0.0};
            if (index < lcstring.size()) {
                val_add = readNumericalWords(lcstring.substr(index), index_sub);
                if (!std::isnan(val_add)) {
                    if (val_add >= val) {
                        val = val * val_add;
                        val_add = 0.0;
                    }
                    index += index_sub;
                } else {
                    val_add = 0.0;
                }
            }
            // read the previous part
            double val_p2 =
                readNumericalWords(lcstring.substr(0, loc), index_sub);
            if (std::isnan(val_p2) || index_sub < loc) {
                index = index_sub;
                return val_p2;
            }
            val *= val_p2;
            val += val_add;
            return val;
        }
    }
    // clean up "and"
    if (lcstring.compare(0, 3, "and") == 0) {
        index += 3;
    }
    // what we are left with is values below a hundred
    for (const auto& wp : decadeWords) {
        if (lcstring.compare(index, std::get<2>(wp), std::get<0>(wp)) == 0) {
            val = std::get<1>(wp);
            index += std::get<2>(wp);
            if (lcstring.size() > index) {
                if (lcstring[index] == '-') {
                    ++index;
                }
                double toTen = read1To10(lcstring, index);
                if (!std::isnan(toTen)) {
                    val += toTen;
                }
            }
            return val;
        }
    }
    val = readTeens(lcstring, index);
    if (!std::isnan(val)) {
        return val;
    }
    val = read1To10(lcstring, index);
    return val;
}